

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O2

void SUNDlsMat_denseScale(realtype c,realtype **a,sunindextype m,sunindextype n)

{
  realtype *prVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = 0;
  uVar4 = (ulong)(uint)m;
  if (m < 1) {
    uVar4 = uVar2;
  }
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar2;
  }
  for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
    prVar1 = a[uVar2];
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      prVar1[uVar5] = prVar1[uVar5] * c;
    }
  }
  return;
}

Assistant:

void SUNDlsMat_denseScale(realtype c, realtype **a, sunindextype m, sunindextype n)
{
  sunindextype i, j;
  realtype *col_j;

  for (j=0; j < n; j++) {
    col_j = a[j];
    for (i=0; i < m; i++)
      col_j[i] *= c;
  }
}